

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<7UL>
mserialize::cx_strcat<1ul,1ul,1ul,1ul,2ul,1ul>
          (cx_string<1UL> *strings,cx_string<1UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<1UL> *strings_3,cx_string<2UL> *strings_4,cx_string<1UL> *strings_5)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  ulong local_80;
  char buffer [8];
  ulong local_70 [8];
  cx_string<1UL> *local_30 [4];
  cx_string<2UL> *local_10;
  cx_string<1UL> *local_8;
  
  puVar1 = &local_80;
  local_80 = 0;
  local_30[0] = strings;
  local_30[1] = strings_1;
  local_30[2] = strings_2;
  local_30[3] = strings_3;
  local_10 = strings_4;
  local_8 = strings_5;
  lVar2 = 1;
  do {
    if (local_70[lVar2 + -1] != 0) {
      uVar3 = 0;
      do {
        *(char *)((long)puVar1 + uVar3) = local_30[lVar2 + -1]->_data[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < local_70[lVar2 + -1]);
      puVar1 = (ulong *)((long)puVar1 + uVar3);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  return (cx_string<7UL>)(local_80 & 0xffffffffffffff);
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}